

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O2

void helper_vslv_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  long lVar1;
  uint uVar2;
  
  lVar1 = 0x10;
  while (lVar1 != 0) {
    uVar2 = 0;
    if (lVar1 != 1) {
      uVar2 = (uint)a->u8[lVar1 + -2];
    }
    r->u8[lVar1 + -1] =
         (uint8_t)((((uint)a->u8[lVar1 + -1] << 8 | uVar2) << (b->u8[lVar1 + -1] & 7)) >> 8);
    lVar1 = lVar1 + -1;
  }
  return;
}

Assistant:

void helper_vslv(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{
    int i;
    unsigned int shift, bytes, size;

    size = ARRAY_SIZE(r->u8);
    for (i = 0; i < size; i++) {
        shift = b->VsrB(i) & 0x7;             /* extract shift value */
        bytes = (a->VsrB(i) << 8) +           /* extract adjacent bytes */
            (((i + 1) < size) ? a->VsrB(i + 1) : 0);
        r->VsrB(i) = (bytes << shift) >> 8;   /* shift and store result */
    }
}